

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O1

void __thiscall FakeOutput::FakeOutput(FakeOutput *this)

{
  SimpleString::SimpleString(&this->file,"");
  SimpleString::SimpleString(&this->console,"");
  this->SaveFOpen = PlatformSpecificFOpen;
  this->SaveFPuts = PlatformSpecificFPuts;
  this->SaveFClose = PlatformSpecificFClose;
  PlatformSpecificFOpen = fopen_fake;
  PlatformSpecificFPuts = fputs_fake;
  PlatformSpecificFClose = fclose_fake;
  currentFake = this;
  return;
}

Assistant:

FakeOutput() : SaveFOpen(PlatformSpecificFOpen), SaveFPuts(PlatformSpecificFPuts),
        SaveFClose(PlatformSpecificFClose)
    {
        installFakes();
        currentFake = this;
    }